

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<std::__exception_ptr::exception_ptr_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<std::__exception_ptr::exception_ptr_const&> *this,exception_ptr *rhs)

{
  lest *this_00;
  exception_ptr *in_R8;
  allocator<char> local_69;
  exception_ptr local_68 [4];
  string local_48;
  bool local_21;
  string *local_20;
  exception_ptr *rhs_local;
  expression_lhs<const_std::__exception_ptr::exception_ptr_&> *this_local;
  
  local_20 = (string *)rhs;
  rhs_local = (exception_ptr *)this;
  this_local = (expression_lhs<const_std::__exception_ptr::exception_ptr_&> *)__return_storage_ptr__
  ;
  local_21 = std::__exception_ptr::operator==(*(exception_ptr **)this,rhs);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"==",&local_69);
  to_string<std::__exception_ptr::exception_ptr,std::__exception_ptr::exception_ptr>
            (&local_48,this_00,local_68,local_20,in_R8);
  result::result<bool>(__return_storage_ptr__,&local_21,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result{ lhs <  rhs, to_string( lhs, "<" , rhs ) }; }